

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moderation.cpp
# Opt level: O3

void Commands::Kick(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *arguments,Command_Source *from,bool announce)

{
  pointer pbVar1;
  pointer pcVar2;
  int iVar3;
  undefined4 extraout_var;
  Character *victim;
  string local_68;
  function<void_(World_*,_Command_Source_*,_Character_*,_bool)> local_48;
  
  iVar3 = (*from->_vptr_Command_Source[4])(from);
  pbVar1 = (arguments->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (pbVar1->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + pbVar1->_M_string_length);
  victim = World::GetCharacter((World *)CONCAT44(extraout_var,iVar3),&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_48.super__Function_base._M_functor._M_unused._M_object = World::Kick;
  local_48.super__Function_base._M_functor._8_8_ = 0;
  local_48._M_invoker =
       std::
       _Function_handler<void_(World_*,_Command_Source_*,_Character_*,_bool),_std::_Mem_fn<void_(World::*)(Command_Source_*,_Character_*,_bool)>_>
       ::_M_invoke;
  local_48.super__Function_base._M_manager =
       std::
       _Function_handler<void_(World_*,_Command_Source_*,_Character_*,_bool),_std::_Mem_fn<void_(World::*)(Command_Source_*,_Character_*,_bool)>_>
       ::_M_manager;
  do_punishment(from,victim,&local_48,announce);
  if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_48.super__Function_base._M_manager)
              ((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  return;
}

Assistant:

void Kick(const std::vector<std::string>& arguments, Command_Source* from, bool announce = true)
{
	Character* victim = from->SourceWorld()->GetCharacter(arguments[0]);
	do_punishment(from, victim, std::mem_fn(&World::Kick), announce);
}